

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *lhs_expression,char *rhs_expression,double lhs_value,
          double rhs_value)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  AssertionResult AVar3;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  stringstream rhs_ss;
  stringstream lhs_ss;
  stringstream local_378 [32];
  stringstream local_358 [32];
  FloatingPointUnion local_338;
  FloatingPointUnion local_330;
  stringstream local_328 [16];
  long local_318;
  undefined8 auStack_310 [46];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 auStack_188 [46];
  
  local_338.value_ = rhs_value;
  local_330.value_ = lhs_value;
  bVar1 = FloatingPoint<double>::AlmostEquals
                    ((FloatingPoint<double> *)&local_330,(FloatingPoint<double> *)&local_338);
  if (bVar1) {
    testing::AssertionSuccess();
    sVar2.ptr_ = extraout_RDX;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    *(undefined8 *)((long)auStack_188 + *(long *)(local_190 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(lhs_value);
    std::__cxx11::stringstream::stringstream(local_328);
    *(undefined8 *)((long)auStack_310 + *(long *)(local_318 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(rhs_value);
    testing::internal::StringStreamToString(local_358);
    testing::internal::StringStreamToString(local_378);
    testing::internal::EqFailure
              ((char *)this,lhs_expression,(string *)rhs_expression,(string *)local_358,
               SUB81(local_378,0));
    std::__cxx11::string::~string((string *)local_378);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::stringstream::~stringstream(local_328);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    sVar2.ptr_ = extraout_RDX_00;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}